

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void hermite_ek_compute(int n,double *x,double *w)

{
  ulong uVar1;
  double *e;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = tgamma(0.5);
  uVar3 = (ulong)(uint)n;
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = uVar3 * 8;
  }
  e = (double *)operator_new__(uVar2);
  if (n < 1) {
LAB_001dce88:
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    *w = dVar4;
    imtqlx(n,x,e,w);
    if ((n & 0x80000001U) != 1) goto LAB_001dcf3c;
LAB_001dcf16:
    x[n - 1U >> 1] = 0.0;
  }
  else {
    uVar2 = 0;
    do {
      uVar1 = uVar2 + 1;
      dVar5 = (double)(int)uVar1 * 0.5;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      e[uVar2] = dVar5;
      uVar2 = uVar1;
    } while (uVar3 != uVar1);
    if (n < 1) goto LAB_001dce88;
    memset(x,0,uVar3 * 8);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    *w = dVar4;
    if (n == 1) {
      imtqlx(1,x,e,w);
      goto LAB_001dcf16;
    }
    memset(w + 1,0,(ulong)(n - 1) << 3);
    imtqlx(n,x,e,w);
    if ((n & 1U) != 0) goto LAB_001dcf16;
  }
  uVar2 = 0;
  do {
    w[uVar2] = w[uVar2] * w[uVar2];
    uVar2 = uVar2 + 1;
  } while (uVar3 != uVar2);
LAB_001dcf3c:
  operator_delete__(e);
  return;
}

Assistant:

void hermite_ek_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_EK_COMPUTE computes a Gauss-Hermite quadrature rule.
//
//  Discussion:
//
//    The code uses an algorithm by Elhay and Kautsky.
//
//    The abscissas are the zeros of the N-th order Hermite polynomial.
//
//    The integral:
//
//      integral ( -oo < x < +oo ) exp ( - x * x ) * f(x) dx
//
//    The quadrature rule:
//
//      sum ( 1 <= i <= n ) w(i) * f ( x(i) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    09 May 2012
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int N, the number of abscissas.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double arg;
  double *bj;
  int i;
  double zemu;
//
//  Define the zero-th moment.
//
  arg = 0.5;
  zemu = tgamma ( arg );
//
//  Define the Jacobi matrix.
//
  bj = new double[n];

  for ( i = 0; i < n; i++ )
  {
    bj[i] = sqrt ( double( i + 1 ) / 2.0 );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = 0.0;
  }

  w[0] = sqrt ( zemu );
  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
//
//  Diagonalize the Jacobi matrix.
//
  imtqlx ( n, x, bj, w );
//
//  If N is odd, force the center X to be 0.
//
  if ( ( n % 2 ) == 1 )
  {
    x[(n-1)/2] = 0.0;
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }

  delete [] bj;

  return;
}